

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQBool sqstd_rex_matchcclass(SQInteger cclass,SQChar c)

{
  int iVar1;
  SQChar c_local;
  SQInteger cclass_local;
  
  switch(cclass) {
  case 0x41:
    iVar1 = isalpha((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 == 0);
    break;
  default:
    cclass_local = 0;
    break;
  case 0x43:
    iVar1 = iscntrl((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 == 0);
    break;
  case 0x44:
    iVar1 = isdigit((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 == 0);
    break;
  case 0x50:
    iVar1 = ispunct((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 == 0);
    break;
  case 0x53:
    iVar1 = isspace((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 == 0);
    break;
  case 0x57:
    iVar1 = isalnum((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 == 0 && c != '_');
    break;
  case 0x58:
    iVar1 = isxdigit((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 == 0);
    break;
  case 0x61:
    iVar1 = isalpha((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 != 0);
    break;
  case 99:
    iVar1 = iscntrl((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 != 0);
    break;
  case 100:
    iVar1 = isdigit((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 != 0);
    break;
  case 0x6c:
    iVar1 = islower((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 != 0);
    break;
  case 0x70:
    iVar1 = ispunct((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 != 0);
    break;
  case 0x73:
    iVar1 = isspace((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 != 0);
    break;
  case 0x75:
    iVar1 = isupper((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 != 0);
    break;
  case 0x77:
    iVar1 = isalnum((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 != 0 || c == '_');
    break;
  case 0x78:
    iVar1 = isxdigit((int)c);
    cclass_local = (SQInteger)(int)(uint)(iVar1 != 0);
  }
  return cclass_local;
}

Assistant:

static SQBool sqstd_rex_matchcclass(SQInteger cclass,SQChar c)
{
    switch(cclass) {
    case 'a': return isalpha(c)?SQTrue:SQFalse;
    case 'A': return !isalpha(c)?SQTrue:SQFalse;
    case 'w': return (isalnum(c) || c == '_')?SQTrue:SQFalse;
    case 'W': return (!isalnum(c) && c != '_')?SQTrue:SQFalse;
    case 's': return isspace(c)?SQTrue:SQFalse;
    case 'S': return !isspace(c)?SQTrue:SQFalse;
    case 'd': return isdigit(c)?SQTrue:SQFalse;
    case 'D': return !isdigit(c)?SQTrue:SQFalse;
    case 'x': return isxdigit(c)?SQTrue:SQFalse;
    case 'X': return !isxdigit(c)?SQTrue:SQFalse;
    case 'c': return iscntrl(c)?SQTrue:SQFalse;
    case 'C': return !iscntrl(c)?SQTrue:SQFalse;
    case 'p': return ispunct(c)?SQTrue:SQFalse;
    case 'P': return !ispunct(c)?SQTrue:SQFalse;
    case 'l': return islower(c)?SQTrue:SQFalse;
    case 'u': return isupper(c)?SQTrue:SQFalse;
    }
    return SQFalse; /*cannot happen*/
}